

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O0

void ghash_final(ghash_ctx *ctx,uint8_t *out)

{
  uint8_t local_20 [8];
  uint8_t lenbuf [8];
  uint8_t *out_local;
  ghash_ctx *ctx_local;
  
  lenbuf = (uint8_t  [8])out;
  if ((ctx->state == 1) || (ctx->state == 2)) {
    ghash_add_pad(ctx);
    ctx->state = 0;
  }
  write64_be(ctx->len_aad << 3,local_20);
  ghash_add(ctx,local_20,8);
  write64_be(ctx->len_cipher << 3,local_20);
  ghash_add(ctx,local_20,8);
  if (ctx->buffer_used != 0) {
    abort();
  }
  cf_gf128_tobytes_be(ctx->Y,(uint8_t *)lenbuf);
  return;
}

Assistant:

static void ghash_final(ghash_ctx *ctx, uint8_t out[16])
{
  uint8_t lenbuf[8];

  if (ctx->state == STATE_AAD || ctx->state == STATE_CIPHER)
  {
    ghash_add_pad(ctx);
    ctx->state = STATE_INVALID;
  }

  /* Add len(A) || len(C) */
  write64_be(ctx->len_aad * 8, lenbuf);
  ghash_add(ctx, lenbuf, sizeof lenbuf);

  write64_be(ctx->len_cipher * 8, lenbuf);
  ghash_add(ctx, lenbuf, sizeof lenbuf);

  assert(ctx->buffer_used == 0);
  cf_gf128_tobytes_be(ctx->Y, out);
}